

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedundantSetElimination.cpp
# Opt level: O0

void wasm::anon_unknown_101::RedundantSetElimination::doVisitLocalSet
               (RedundantSetElimination *self,Expression **currp)

{
  Expression **local_18;
  Expression **currp_local;
  RedundantSetElimination *self_local;
  
  if ((self->
      super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
      ).
      super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
      .currBasicBlock != (BasicBlock *)0x0) {
    local_18 = currp;
    currp_local = (Expression **)self;
    std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
              (&(((self->
                  super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                  ).
                  super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                 .currBasicBlock)->contents).items,&local_18);
  }
  return;
}

Assistant:

static void doVisitLocalSet(RedundantSetElimination* self,
                              Expression** currp) {
    if (self->currBasicBlock) {
      self->currBasicBlock->contents.items.push_back(currp);
    }
  }